

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz.cpp
# Opt level: O0

void __thiscall
wavingz::demod::state_machine::symbol_sm::start_of_frame_0_t::process
          (start_of_frame_0_t *this,symbol_sm_t *ctx,optional<bool> *symbol)

{
  optional<bool> *poVar1;
  bool bVar2;
  reference_const_type pbVar3;
  start_of_frame_1_t *psVar4;
  size_t sVar5;
  payload_t *this_00;
  unique_ptr<wavingz::demod::state_machine::symbol_sm::payload_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::payload_t>_>
  local_58;
  unique_ptr<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
  local_50;
  unique_ptr<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t>_>
  local_48;
  unique_ptr<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
  local_40;
  unique_ptr<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t>_>
  local_38;
  unique_ptr<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
  local_30 [2];
  optional<bool> *local_20;
  optional<bool> *symbol_local;
  symbol_sm_t *ctx_local;
  start_of_frame_0_t *this_local;
  
  local_20 = symbol;
  symbol_local = (optional<bool> *)ctx;
  ctx_local = (symbol_sm_t *)this;
  bVar2 = boost::operator==(symbol);
  poVar1 = symbol_local;
  if (bVar2) {
    psVar4 = (start_of_frame_1_t *)operator_new(0x10);
    memset(psVar4,0,0x10);
    start_of_frame_1_t::start_of_frame_1_t(psVar4);
    std::
    unique_ptr<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t,std::default_delete<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t>>
    ::
    unique_ptr<std::default_delete<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t>,void>
              ((unique_ptr<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t,std::default_delete<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t>>
                *)&local_38,psVar4);
    std::
    unique_ptr<wavingz::demod::state_machine::symbol_sm::state_base_t,std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>>
    ::
    unique_ptr<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t,std::default_delete<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t>,void>
              ((unique_ptr<wavingz::demod::state_machine::symbol_sm::state_base_t,std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>>
                *)local_30,&local_38);
    symbol_sm_t::state((symbol_sm_t *)poVar1,local_30);
    std::
    unique_ptr<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
    ::~unique_ptr(local_30);
    std::
    unique_ptr<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t>_>
    ::~unique_ptr(&local_38);
  }
  else {
    pbVar3 = boost::optional<bool>::operator*(local_20);
    poVar1 = symbol_local;
    if ((*pbVar3 & 1U) == 0) {
      sVar5 = this->cnt + 1;
      this->cnt = sVar5;
      if (sVar5 == 4) {
        this_00 = (payload_t *)operator_new(0x30);
        memset(this_00,0,0x30);
        payload_t::payload_t(this_00);
        std::
        unique_ptr<wavingz::demod::state_machine::symbol_sm::payload_t,std::default_delete<wavingz::demod::state_machine::symbol_sm::payload_t>>
        ::unique_ptr<std::default_delete<wavingz::demod::state_machine::symbol_sm::payload_t>,void>
                  ((unique_ptr<wavingz::demod::state_machine::symbol_sm::payload_t,std::default_delete<wavingz::demod::state_machine::symbol_sm::payload_t>>
                    *)&local_58,this_00);
        std::
        unique_ptr<wavingz::demod::state_machine::symbol_sm::state_base_t,std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>>
        ::
        unique_ptr<wavingz::demod::state_machine::symbol_sm::payload_t,std::default_delete<wavingz::demod::state_machine::symbol_sm::payload_t>,void>
                  ((unique_ptr<wavingz::demod::state_machine::symbol_sm::state_base_t,std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>>
                    *)&local_50,&local_58);
        symbol_sm_t::state((symbol_sm_t *)poVar1,&local_50);
        std::
        unique_ptr<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
        ::~unique_ptr(&local_50);
        std::
        unique_ptr<wavingz::demod::state_machine::symbol_sm::payload_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::payload_t>_>
        ::~unique_ptr(&local_58);
      }
    }
    else {
      psVar4 = (start_of_frame_1_t *)operator_new(0x10);
      memset(psVar4,0,0x10);
      start_of_frame_1_t::start_of_frame_1_t(psVar4);
      std::
      unique_ptr<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t,std::default_delete<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t>>
      ::
      unique_ptr<std::default_delete<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t>,void>
                ((unique_ptr<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t,std::default_delete<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t>>
                  *)&local_48,psVar4);
      std::
      unique_ptr<wavingz::demod::state_machine::symbol_sm::state_base_t,std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>>
      ::
      unique_ptr<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t,std::default_delete<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t>,void>
                ((unique_ptr<wavingz::demod::state_machine::symbol_sm::state_base_t,std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>>
                  *)&local_40,&local_48);
      symbol_sm_t::state((symbol_sm_t *)poVar1,&local_40);
      std::
      unique_ptr<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
      ::~unique_ptr(&local_40);
      std::
      unique_ptr<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t>_>
      ::~unique_ptr(&local_48);
    }
  }
  return;
}

Assistant:

void
start_of_frame_0_t::process(symbol_sm_t& ctx,
                            const boost::optional<bool>& symbol)
{
    if (symbol == boost::none)
    {
        ctx.state(
          std::unique_ptr<start_of_frame_1_t>(new start_of_frame_1_t()));
    }
    else if (*symbol)
    {
        ctx.state(
          std::unique_ptr<start_of_frame_1_t>(new start_of_frame_1_t()));
    }
    else if (++cnt == 4) // we expect four consecutive '0'
    {
        ctx.state(std::unique_ptr<payload_t>(new payload_t()));
    }
}